

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O3

lzma_ret lzma_index_stream_flags(lzma_index *i,lzma_stream_flags *stream_flags)

{
  index_tree_node *piVar1;
  index_tree_node *piVar2;
  index_tree_node *piVar3;
  lzma_vli lVar4;
  lzma_vli lVar5;
  index_tree_node *piVar6;
  lzma_ret lVar7;
  
  lVar7 = LZMA_PROG_ERROR;
  if ((stream_flags != (lzma_stream_flags *)0x0 && i != (lzma_index *)0x0) &&
     (lVar7 = lzma_stream_flags_compare(stream_flags,stream_flags), lVar7 == LZMA_OK)) {
    piVar1 = (i->streams).rightmost;
    piVar1[3].right = *(index_tree_node **)&stream_flags->reserved_int2;
    piVar2 = *(index_tree_node **)stream_flags;
    piVar3 = (index_tree_node *)stream_flags->backward_size;
    lVar4 = *(lzma_vli *)&stream_flags->check;
    lVar5 = *(lzma_vli *)&stream_flags->reserved_enum2;
    piVar6 = *(index_tree_node **)&stream_flags->reserved_bool5;
    piVar1[3].parent = *(index_tree_node **)&stream_flags->reserved_enum4;
    piVar1[3].left = piVar6;
    piVar1[3].uncompressed_base = lVar4;
    piVar1[3].compressed_base = lVar5;
    piVar1[2].left = piVar2;
    piVar1[2].right = piVar3;
    lVar7 = LZMA_OK;
  }
  return lVar7;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_stream_flags(lzma_index *i, const lzma_stream_flags *stream_flags)
{
	index_stream *s;

	if (i == NULL || stream_flags == NULL)
		return LZMA_PROG_ERROR;

	// Validate the Stream Flags.
	return_if_error(lzma_stream_flags_compare(
			stream_flags, stream_flags));

	s = (index_stream *)(i->streams.rightmost);
	s->stream_flags = *stream_flags;

	return LZMA_OK;
}